

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O2

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  
  uVar1 = *(uint *)((long)userData + 0x210);
  uVar2 = (uint)framesPerBuffer;
  if (uVar1 < framesPerBuffer) {
    uVar2 = uVar1;
  }
  lVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  for (; uVar3 != (uint)lVar4; lVar4 = lVar4 + 1) {
    fVar5 = GeneratePinkNoise((PinkNoise *)userData);
    *(float *)((long)outputBuffer + lVar4 * 8) = fVar5;
    fVar5 = GeneratePinkNoise((PinkNoise *)((long)userData + 0x108));
    *(float *)((long)outputBuffer + lVar4 * 8 + 4) = fVar5;
  }
  *(int *)((long)userData + 0x210) = *(int *)((long)userData + 0x210) - uVar2;
  return (int)(uVar1 < framesPerBuffer);
}

Assistant:

static int patestCallback(const void*                     inputBuffer,
                          void*                           outputBuffer,
                          unsigned long                   framesPerBuffer,
			              const PaStreamCallbackTimeInfo* timeInfo,
			              PaStreamCallbackFlags           statusFlags,
                          void*                           userData)
{
    int finished;
    int i;
    int numFrames;
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    (void) inputBuffer; /* Prevent "unused variable" warnings. */

    /* Are we almost at end. */
    if( data->sampsToGo < framesPerBuffer )
    {
        numFrames = data->sampsToGo;
        finished = 1;
    }
    else
    {
        numFrames = framesPerBuffer;
        finished = 0;
    }
    for( i=0; i<numFrames; i++ )
    {
        *out++ = GeneratePinkNoise( &data->leftPink );
        *out++ = GeneratePinkNoise( &data->rightPink );
    }
    data->sampsToGo -= numFrames;
    return finished;
}